

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

Server * __thiscall httplib::Server::Post(Server *this,char *pattern,Handler *handler)

{
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  local_80;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_40;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_40,pattern,0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_&,_true>
            (&local_80,&local_40,handler);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            ((vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
              *)&this->post_handlers_,&local_80);
  if (local_80.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.second.super__Function_base._M_manager)
              ((_Any_data *)&local_80.second,(_Any_data *)&local_80.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_80.first);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_40);
  return this;
}

Assistant:

inline Server& Server::Post(const char* pattern, Handler handler)
{
    post_handlers_.push_back(std::make_pair(std::regex(pattern), handler));
    return *this;
}